

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::substring::merge_forward<char*,bitmap::BitmapArray<long>::iterator,long*>
               (char *T,iterator PA,long *buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  BitmapArray<long> *pBVar5;
  pos_type pVar6;
  long *plVar7;
  pos_type pVar8;
  iterator p1;
  iterator p2;
  ulong local_58;
  
  pVar8 = first.pos_;
  pBVar5 = first.array_;
  p1.array_ = PA.array_;
  pVar6 = pVar8;
  plVar7 = buf;
  if (middle.pos_ - pVar8 != 0) {
    do {
      lVar2 = *plVar7;
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar6);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,lVar2);
      pVar6 = pVar6 + 1;
      plVar7 = plVar7 + 1;
    } while (middle.pos_ != pVar6);
  }
  local_58 = middle.pos_;
  plVar7 = buf + (middle.pos_ - pVar8);
  iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8);
  do {
    while( true ) {
      lVar2 = *buf;
      iVar4 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_58);
      p1.pos_ = lVar2 + PA.pos_;
      p2.pos_ = CONCAT44(extraout_var_00,iVar4) + PA.pos_;
      p2.array_ = p1.array_;
      iVar4 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      pVar6 = pVar8;
      if (iVar4 < 0) break;
      if (iVar4 == 0) {
        iVar4 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_58);
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (middle.array_,local_58,~CONCAT44(extraout_var_05,iVar4));
        do {
          pVar6 = pVar8 + 1;
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar8,*buf);
          iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar6);
          *buf = CONCAT44(extraout_var_06,iVar4);
          buf = buf + 1;
          if (plVar7 <= buf) goto LAB_0010badd;
          pVar8 = pVar6;
        } while (*buf < 0);
        do {
          pVar8 = pVar6 + 1;
          iVar4 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_58);
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,CONCAT44(extraout_var_07,iVar4));
          uVar1 = local_58 + 1;
          iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,local_58,CONCAT44(extraout_var_08,iVar4));
          if (last.pos_ <= uVar1) goto LAB_0010baaf;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar1);
          local_58 = uVar1;
          pVar6 = pVar8;
        } while (extraout_var_09 < 0);
      }
      else {
        do {
          pVar8 = pVar6 + 1;
          iVar4 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_58);
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,CONCAT44(extraout_var_01,iVar4));
          uVar1 = local_58 + 1;
          iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,local_58,CONCAT44(extraout_var_02,iVar4));
          if (last.pos_ <= uVar1) goto LAB_0010ba7b;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar1);
          local_58 = uVar1;
          pVar6 = pVar8;
        } while (extraout_var_03 < 0);
      }
    }
    do {
      pVar8 = pVar6 + 1;
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,*buf);
      iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8);
      *buf = CONCAT44(extraout_var_04,iVar4);
      buf = buf + 1;
      if (plVar7 <= buf) goto LAB_0010badd;
      pVar6 = pVar8;
    } while (*buf < 0);
  } while( true );
LAB_0010ba7b:
  do {
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar8,*buf);
    iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8 + 1);
    *buf = CONCAT44(extraout_var_10,iVar4);
    buf = buf + 1;
    pVar8 = pVar8 + 1;
  } while (buf < plVar7);
  goto LAB_0010badd;
LAB_0010baaf:
  do {
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar8,*buf);
    iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8 + 1);
    *buf = CONCAT44(extraout_var_11,iVar4);
    buf = buf + 1;
    pVar8 = pVar8 + 1;
  } while (buf < plVar7);
LAB_0010badd:
  plVar7[-1] = CONCAT44(extraout_var,iVar3);
  return;
}

Assistant:

void merge_forward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  bufend = buf + (middle - first);
  helper::vecswap(first, middle, buf);

  for (t = *first, i = first, j = buf, k = middle;;) {
    r = compare(T, PA + *j, PA + *k, depth);
    if (r < 0) {
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);
    } else if (r > 0) {
      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    } else {
      *k = ~*k;
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);

      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    }
  }
}